

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

TransactionContext * __thiscall
cfd::Psbt::GetTransactionContext(TransactionContext *__return_storage_ptr__,Psbt *this)

{
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  string local_78;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_58 [2];
  
  cfd::core::Psbt::GetTransaction();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  TransactionContext::TransactionContext(__return_storage_ptr__,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  core::Transaction::~Transaction((Transaction *)local_58);
  GetUtxoDataAll(local_58,this,kMainnet);
  TransactionContext::CollectInputUtxo(__return_storage_ptr__,local_58);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(local_58);
  return __return_storage_ptr__;
}

Assistant:

TransactionContext Psbt::GetTransactionContext() const {
  TransactionContext tx(GetTransaction().GetHex());
  std::vector<UtxoData> utxo_list = GetUtxoDataAll();
  tx.CollectInputUtxo(utxo_list);
  return tx;
}